

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v7::print<char[7],std::basic_string_view<char,std::char_traits<char>>const&,int,char>
               (basic_ostream<char,_std::char_traits<char>_> *os,char (*format_str) [7],
               basic_string_view<char,_std::char_traits<char>_> *args,int *args_1)

{
  remove_reference_t<int> *in_R8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>,_int>
  local_88;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_60;
  basic_string_view<char> local_50;
  remove_reference_t<const_std::basic_string_view<char>_&> *local_40;
  int *args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  char (*format_str_local) [7];
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  basic_ostream<char,_std::char_traits<char>_> *local_10;
  
  local_40 = (remove_reference_t<const_std::basic_string_view<char>_&> *)args_1;
  args_local_1 = (int *)args;
  args_local = (basic_string_view<char,_std::char_traits<char>_> *)format_str;
  format_str_local = (char (*) [7])os;
  local_50 = to_string_view<char,_0>(*format_str);
  make_args_checked<std::basic_string_view<char,std::char_traits<char>>const&,int,char[7],char>
            (&local_88,(v7 *)args_local,(char (*) [7])args_local_1,local_40,in_R8);
  local_18 = &local_60;
  os_local = (basic_ostream<char,_std::char_traits<char>_> *)&local_88;
  local_10 = os_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_18,0x1d,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)os_local);
  vprint<char>(os,local_50,local_60);
  return;
}

Assistant:

void print(std::basic_ostream<Char>& os, const S& format_str, Args&&... args) {
  vprint(os, to_string_view(format_str),
         fmt::make_args_checked<Args...>(format_str, args...));
}